

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int resolve_amb_greedy(D_Parser *dp,int n,D_ParseNode **v)

{
  int iVar1;
  D_ParseNode *local_68;
  D_ParseNode *local_58;
  PNode *local_50;
  PNode *local_40;
  int local_2c;
  int selected_node;
  int result;
  int i;
  D_ParseNode **v_local;
  int n_local;
  D_Parser *dp_local;
  
  local_2c = 0;
  selected_node = 1;
  do {
    if (n <= selected_node) {
      return local_2c;
    }
    if (v[selected_node] == (D_ParseNode *)0x0) {
      local_40 = (PNode *)0x0;
    }
    else {
      local_40 = (PNode *)(v[selected_node] + -2);
    }
    if (v[local_2c] == (D_ParseNode *)0x0) {
      local_50 = (PNode *)0x0;
    }
    else {
      local_50 = (PNode *)(v[local_2c] + -2);
    }
    iVar1 = cmp_greediness((Parser *)dp,local_40,local_50);
    if (iVar1 < 0) {
LAB_0014fd37:
      local_2c = selected_node;
    }
    else if (iVar1 == 0) {
      if (v[selected_node] == (D_ParseNode *)0x0) {
        local_58 = (D_ParseNode *)0x0;
      }
      else {
        local_58 = v[selected_node] + -2;
      }
      if (v[local_2c] == (D_ParseNode *)0x0) {
        local_68 = (D_ParseNode *)0x0;
      }
      else {
        local_68 = v[local_2c] + -2;
      }
      if (*(uint *)&(local_58->start_loc).ws < *(uint *)&(local_68->start_loc).ws)
      goto LAB_0014fd37;
    }
    selected_node = selected_node + 1;
  } while( true );
}

Assistant:

int resolve_amb_greedy(D_Parser *dp, int n, D_ParseNode **v) {
  int i, result, selected_node = 0;

  for (i = 1; i < n; i++) {
    result = cmp_greediness((Parser *)dp, D_ParseNode_to_PNode(v[i]), D_ParseNode_to_PNode(v[selected_node]));
    if (result < 0 ||
        (result == 0 && D_ParseNode_to_PNode(v[i])->height < D_ParseNode_to_PNode(v[selected_node])->height))
      selected_node = i;
  }
  return selected_node;
}